

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uiter.cpp
# Opt level: O0

UChar32 utf8IteratorNext(UCharIterator *iter)

{
  int32_t iVar1;
  void *pvVar2;
  byte bVar3;
  int iVar4;
  int local_38;
  int local_34;
  byte local_2d;
  uint local_2c;
  uint8_t __t;
  UChar32 c;
  uint8_t *s;
  UChar trail;
  int32_t index;
  UCharIterator *iter_local;
  
  if (iter->reservedField != 0) {
    iVar1 = iter->reservedField;
    iter->reservedField = 0;
    if (-1 < iter->index) {
      iter->index = iter->index + 1;
    }
    return (uint)((ushort)iVar1 & 0x3ff | 0xdc00);
  }
  if (iter->limit <= iter->start) {
    return -1;
  }
  pvVar2 = iter->context;
  iVar4 = iter->start;
  iter->start = iVar4 + 1;
  bVar3 = *(byte *)((long)pvVar2 + (long)iVar4);
  local_2c = (uint)bVar3;
  if ((bVar3 & 0x80) == 0) goto LAB_003a9532;
  if (iter->start != iter->limit) {
    if (local_2c < 0xe0) {
      if (0xc1 < local_2c) {
        local_2c = local_2c & 0x1f;
LAB_003a94e3:
        bVar3 = *(char *)((long)pvVar2 + (long)iter->start) + 0x80;
        if (bVar3 < 0x40) {
          local_2c = local_2c << 6 | (uint)bVar3;
          iter->start = iter->start + 1;
          goto LAB_003a9532;
        }
      }
    }
    else if (local_2c < 0xf0) {
      local_2c = local_2c & 0xf;
      local_2d = *(byte *)((long)pvVar2 + (long)iter->start);
      if (((int)" 000000000000\x1000"[(int)local_2c] & 1 << (sbyte)((int)(uint)local_2d >> 5)) != 0)
      {
        local_2d = local_2d & 0x3f;
LAB_003a94a2:
        local_2c = local_2c << 6 | (uint)local_2d;
        iVar4 = iter->start + 1;
        iter->start = iVar4;
        if (iVar4 != iter->limit) goto LAB_003a94e3;
      }
    }
    else {
      iVar4 = local_2c - 0xf0;
      if ((iVar4 < 5) &&
         (bVar3 = *(byte *)((long)pvVar2 + (long)iter->start),
         ((int)""[(int)(uint)bVar3 >> 4] & 1 << ((byte)iVar4 & 0x1f)) != 0)) {
        local_2c = iVar4 * 0x40 | bVar3 & 0x3f;
        iVar4 = iter->start + 1;
        iter->start = iVar4;
        if ((iVar4 != iter->limit) &&
           (local_2d = *(char *)((long)pvVar2 + (long)iter->start) + 0x80, local_2d < 0x40))
        goto LAB_003a94a2;
      }
    }
  }
  local_2c = 0xfffd;
LAB_003a9532:
  iVar4 = iter->index;
  if (iVar4 < 0) {
    if ((iter->start == iter->limit) && (-1 < iter->length)) {
      if ((int)local_2c < 0x10000) {
        local_38 = iter->length;
      }
      else {
        local_38 = iter->length + -1;
      }
      iter->index = local_38;
    }
  }
  else {
    local_34 = iVar4 + 1;
    iter->index = local_34;
    if ((iter->length < 0) && (iter->start == iter->limit)) {
      if (0xffff < (int)local_2c) {
        local_34 = iVar4 + 2;
      }
      iter->length = local_34;
    }
  }
  if ((int)local_2c < 0x10000) {
    iter_local._4_4_ = local_2c;
  }
  else {
    iter->reservedField = local_2c;
    iter_local._4_4_ = ((int)local_2c >> 10) + 0xd7c0U & 0xffff;
  }
  return iter_local._4_4_;
}

Assistant:

static UChar32 U_CALLCONV
utf8IteratorNext(UCharIterator *iter) {
    int32_t index;

    if(iter->reservedField!=0) {
        UChar trail=U16_TRAIL(iter->reservedField);
        iter->reservedField=0;
        if((index=iter->index)>=0) {
            iter->index=index+1;
        }
        return trail;
    } else if(iter->start<iter->limit) {
        const uint8_t *s=(const uint8_t *)iter->context;
        UChar32 c;

        U8_NEXT_OR_FFFD(s, iter->start, iter->limit, c);
        if((index=iter->index)>=0) {
            iter->index=++index;
            if(iter->length<0 && iter->start==iter->limit) {
                iter->length= c<=0xffff ? index : index+1;
            }
        } else if(iter->start==iter->limit && iter->length>=0) {
            iter->index= c<=0xffff ? iter->length : iter->length-1;
        }
        if(c<=0xffff) {
            return c;
        } else {
            iter->reservedField=c;
            return U16_LEAD(c);
        }
    } else {
        return U_SENTINEL;
    }
}